

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualbalance.cpp
# Opt level: O0

void __thiscall QualBalance::writeBalance(QualBalance *this,ostream *msgLog)

{
  ostream *poVar1;
  double dVar2;
  double local_30;
  double pctDiff;
  double massOut;
  double massIn;
  ostream *msgLog_local;
  QualBalance *this_local;
  
  poVar1 = std::operator<<(msgLog,"\n  Water Quality Mass Balance");
  std::operator<<(poVar1,"\n  --------------------------");
  poVar1 = std::operator<<(msgLog,"\n  Initial Storage           ");
  std::ostream::operator<<(poVar1,this->initMass / 1000000.0);
  poVar1 = std::operator<<(msgLog,"\n  Mass Inflow               ");
  std::ostream::operator<<(poVar1,this->inflowMass / 1000000.0);
  poVar1 = std::operator<<(msgLog,"\n  Mass Outflow              ");
  std::ostream::operator<<(poVar1,this->outflowMass / 1000000.0);
  poVar1 = std::operator<<(msgLog,"\n  Mass Reacted              ");
  std::ostream::operator<<(poVar1,this->reactedMass / 1000000.0);
  poVar1 = std::operator<<(msgLog,"\n  Final Storage             ");
  std::ostream::operator<<(poVar1,this->storedMass / 1000000.0);
  local_30 = this->initMass + this->inflowMass;
  dVar2 = this->outflowMass + this->reactedMass + this->storedMass;
  if (local_30 <= 0.0) {
    if (dVar2 <= 0.0) {
      local_30 = 0.0;
    }
    else {
      local_30 = ((local_30 - dVar2) * 100.0) / dVar2;
    }
  }
  else {
    local_30 = ((local_30 - dVar2) * 100.0) / local_30;
  }
  poVar1 = std::operator<<(msgLog,"\n  Percent Imbalance         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_30);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void QualBalance::writeBalance(ostream& msgLog)
{
    msgLog <<   "\n  Water Quality Mass Balance"
           <<   "\n  --------------------------";
    msgLog <<   "\n  Initial Storage           " << initMass / 1.e6;
    msgLog <<   "\n  Mass Inflow               " << inflowMass / 1.e6;
    msgLog <<   "\n  Mass Outflow              " << outflowMass / 1.e6;
    msgLog <<   "\n  Mass Reacted              " << reactedMass / 1.e6;
    msgLog <<   "\n  Final Storage             " << storedMass / 1.e6;

    double massIn = initMass + inflowMass;
    double massOut = outflowMass + reactedMass + storedMass;
    double pctDiff = (massIn - massOut);
    if ( massIn > 0.0 ) pctDiff = 100.0 * pctDiff / massIn;
    else if (massOut > 0.0 ) pctDiff = 100.0 * pctDiff / massOut;
    else pctDiff = 0.0;
    msgLog <<   "\n  Percent Imbalance         " << pctDiff << "\n";
}